

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void __thiscall btSoftBody::updateNormals(btSoftBody *this)

{
  Node *pNVar1;
  btVector3 *in_RDI;
  btScalar bVar2;
  btScalar len;
  btVector3 n;
  Face *f;
  int ni;
  int i;
  btVector3 zv;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  btVector3 *v2;
  btVector3 in_stack_ffffffffffffff88;
  btVector3 local_48;
  Face *local_38;
  int local_2c;
  int local_28;
  btScalar local_24;
  btScalar local_20;
  btScalar local_1c;
  btVector3 local_18;
  
  local_1c = 0.0;
  local_20 = 0.0;
  local_24 = 0.0;
  btVector3::btVector3(&local_18,&local_1c,&local_20,&local_24);
  local_28 = 0;
  local_2c = btAlignedObjectArray<btSoftBody::Node>::size
                       ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x37));
  for (; local_28 < local_2c; local_28 = local_28 + 1) {
    pNVar1 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                       ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x37),local_28);
    *(undefined8 *)(pNVar1->m_n).m_floats = local_18.m_floats._0_8_;
    *(undefined8 *)((pNVar1->m_n).m_floats + 2) = local_18.m_floats._8_8_;
  }
  local_28 = 0;
  local_2c = btAlignedObjectArray<btSoftBody::Face>::size
                       ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b));
  for (; local_28 < local_2c; local_28 = local_28 + 1) {
    local_38 = btAlignedObjectArray<btSoftBody::Face>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b),local_28);
    operator-(in_stack_ffffffffffffff88.m_floats._8_8_,in_stack_ffffffffffffff88.m_floats._0_8_);
    v2 = in_stack_ffffffffffffff88.m_floats._0_8_;
    operator-(in_stack_ffffffffffffff88.m_floats._8_8_,v2);
    local_48 = btCross((btVector3 *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                       in_RDI);
    in_stack_ffffffffffffff88 = btVector3::normalized(v2);
    *(long *)(local_38->m_normal).m_floats = in_stack_ffffffffffffff88.m_floats._0_8_;
    *(long *)((local_38->m_normal).m_floats + 2) = in_stack_ffffffffffffff88.m_floats._8_8_;
    btVector3::operator+=(&local_38->m_n[0]->m_n,&local_48);
    btVector3::operator+=(&local_38->m_n[1]->m_n,&local_48);
    btVector3::operator+=(&local_38->m_n[2]->m_n,&local_48);
  }
  local_28 = 0;
  local_2c = btAlignedObjectArray<btSoftBody::Node>::size
                       ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x37));
  for (; local_28 < local_2c; local_28 = local_28 + 1) {
    btAlignedObjectArray<btSoftBody::Node>::operator[]
              ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x37),local_28);
    bVar2 = btVector3::length((btVector3 *)0x26d8ba);
    if (1.1920929e-07 < bVar2) {
      btAlignedObjectArray<btSoftBody::Node>::operator[]
                ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x37),local_28);
      btVector3::operator/=((btVector3 *)CONCAT44(bVar2,in_stack_ffffffffffffff80),in_RDI->m_floats)
      ;
    }
  }
  return;
}

Assistant:

void					btSoftBody::updateNormals()
{

	const btVector3	zv(0,0,0);
	int i,ni;

	for(i=0,ni=m_nodes.size();i<ni;++i)
	{
		m_nodes[i].m_n=zv;
	}
	for(i=0,ni=m_faces.size();i<ni;++i)
	{
		btSoftBody::Face&	f=m_faces[i];
		const btVector3		n=btCross(f.m_n[1]->m_x-f.m_n[0]->m_x,
			f.m_n[2]->m_x-f.m_n[0]->m_x);
		f.m_normal=n.normalized();
		f.m_n[0]->m_n+=n;
		f.m_n[1]->m_n+=n;
		f.m_n[2]->m_n+=n;
	}
	for(i=0,ni=m_nodes.size();i<ni;++i)
	{
		btScalar len = m_nodes[i].m_n.length();
		if (len>SIMD_EPSILON)
			m_nodes[i].m_n /= len;
	}
}